

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O2

XMLCh * xercesc_4_0::XMLBigDecimal::getCanonicalRepresentation(XMLCh *rawData,MemoryManager *memMgr)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  XMLSize_t maxChars;
  int fractDigits;
  int totalDigits;
  int sign;
  ArrayJanitor<char16_t> janName;
  int local_4c;
  int local_48;
  int local_44;
  ArrayJanitor<char16_t> local_40;
  XMLCh *toDelete;
  undefined4 extraout_var_00;
  
  XVar2 = XMLString::stringLen(rawData);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 2);
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar1);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,memMgr);
  parseDecimal(rawData,toDelete,&local_44,&local_48,&local_4c,memMgr);
  XVar2 = XMLString::stringLen(toDelete);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 8);
  pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
  if (local_48 == 0 || local_44 == 0) {
    pXVar3[0] = L'0';
    pXVar3[1] = L'.';
    pXVar3[2] = L'0';
    pXVar4 = pXVar3 + 3;
  }
  else {
    pXVar4 = pXVar3;
    if (local_44 == -1) {
      pXVar4 = pXVar3 + 1;
      *pXVar3 = L'-';
    }
    maxChars = (XMLSize_t)local_4c;
    if (local_48 == local_4c) {
      pXVar4[0] = L'0';
      pXVar4[1] = L'.';
      XMLString::copyNString(pXVar4 + 2,toDelete,XVar2);
      pXVar4 = pXVar4 + 2 + XVar2;
    }
    else if (local_4c == 0) {
      XMLString::copyNString(pXVar4,toDelete,XVar2);
      (pXVar4 + XVar2)[0] = L'.';
      (pXVar4 + XVar2)[1] = L'0';
      pXVar4 = pXVar4 + XVar2 + 2;
    }
    else {
      XVar2 = (XMLSize_t)(local_48 - local_4c);
      XMLString::copyNString(pXVar4,toDelete,XVar2);
      pXVar4 = pXVar4 + XVar2;
      *pXVar4 = L'.';
      XMLString::copyNString(pXVar4 + 1,toDelete + XVar2,maxChars);
      pXVar4 = pXVar4 + 1 + local_4c;
    }
  }
  *pXVar4 = L'\0';
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return pXVar3;
}

Assistant:

XMLCh* XMLBigDecimal::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr)
{

    XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData)+1) * sizeof(XMLCh));
    ArrayJanitor<XMLCh> janName(retBuf, memMgr);
    int   sign, totalDigits, fractDigits;

    try
    {
        parseDecimal(rawData, retBuf, sign, totalDigits, fractDigits, memMgr);
    }
    catch (const NumberFormatException&)
    {
        return 0;
    }


    //Extra space reserved in case strLen is zero
    XMLSize_t strLen = XMLString::stringLen(retBuf);
    XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (strLen + 4) * sizeof(XMLCh));

    if ( (sign == 0) || (totalDigits == 0))
    {
        retBuffer[0] = chDigit_0;
        retBuffer[1] = chPeriod;
        retBuffer[2] = chDigit_0;
        retBuffer[3] = chNull;
    }
    else
    {
        XMLCh* retPtr = retBuffer;

        if (sign == -1)
        {
            *retPtr++ = chDash;
        }

        if (fractDigits == totalDigits)   // no integer
        {           
            *retPtr++ = chDigit_0;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr = chNull;
        }
        else if (fractDigits == 0)        // no fraction
        {
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr++ = chPeriod;
            *retPtr++ = chDigit_0;
            *retPtr   = chNull;
        }
        else  // normal
        {
            int intLen = totalDigits - fractDigits;
            XMLString::copyNString(retPtr, retBuf, intLen);
            retPtr += intLen;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, &(retBuf[intLen]), fractDigits);
            retPtr += fractDigits;
            *retPtr = chNull;
        }

    }
            
    return retBuffer;
}